

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O0

void __thiscall
CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
          (CNetAddr *this,ParamsStream<DataStream_&,_CAddress::SerParams> *s)

{
  long lVar1;
  SerParams *pSVar2;
  CNetAddr *in_RSI;
  ParamsStream<DataStream_&,_CAddress::SerParams> *in_RDI;
  long in_FS_OFFSET;
  ParamsStream<DataStream_&,_CAddress::SerParams> *in_stack_00000020;
  CNetAddr *in_stack_00000028;
  ParamsStream<DataStream_&,_CAddress::SerParams> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = ParamsStream<DataStream_&,_CAddress::SerParams>::GetParams<CNetAddr::SerParams>
                     (in_stack_ffffffffffffffd8);
  if ((pSVar2->super_SerParams).enc == V2) {
    UnserializeV2Stream<ParamsStream<DataStream&,CAddress::SerParams>>
              (in_stack_00000028,in_stack_00000020);
  }
  else {
    UnserializeV1Stream<ParamsStream<DataStream&,CAddress::SerParams>>(in_RSI,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        if (s.template GetParams<SerParams>().enc == Encoding::V2) {
            UnserializeV2Stream(s);
        } else {
            UnserializeV1Stream(s);
        }
    }